

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_vliet.c
# Opt level: O2

void swap_gauss(float *c,float *b,int w,int h,double s)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double M [9];
  double sum;
  double local_128;
  double local_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double local_f0;
  double dStack_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double dStack_38;
  
  if (3.556 <= s) {
    dVar20 = s * 0.9804 + -0.9772023999999999;
  }
  else {
    dVar20 = (s * 0.0561 + 0.5784) * s + -0.2568;
  }
  dVar22 = dVar20 * dVar20;
  dStack_c0 = 1.0 / ((dVar20 * 2.21566 + 3.2037296485000004 + dVar22) * (dVar20 + 1.1668));
  local_d8 = -dVar22 * (dVar20 * 3.0 + 3.38246) * dStack_c0;
  dStack_d0 = dVar20 * dVar22 * dStack_c0;
  local_68._8_4_ = SUB84(local_d8,0);
  local_68._0_8_ = dStack_d0;
  local_68._12_4_ = (int)((ulong)local_d8 >> 0x20);
  local_c8 = (dVar22 * 3.0 + dVar20 * 6.76492 + 5.788961736500001) * dVar20 * dStack_c0;
  dStack_c0 = dStack_c0 * 3.7381117538698008;
  local_b8 = dStack_c0 * dStack_c0;
  uVar2 = w - 1;
  iVar13 = 0;
  uVar12 = 0;
  if (0 < w) {
    uVar12 = (ulong)(uint)w;
  }
  iVar9 = 0;
  if (0 < h) {
    iVar9 = h;
  }
  dVar20 = 1.0 / dStack_c0;
  dVar22 = 1.0 / (1.0 - (local_d8 + local_c8 + dStack_d0));
  pfVar5 = b;
  dStack_b0 = dStack_c0;
  local_a8 = dStack_c0;
  dStack_a0 = dStack_c0;
  local_98 = local_d8;
  dStack_90 = local_c8;
  local_88 = local_b8;
  dStack_80 = local_b8;
  local_78 = dStack_d0;
  dStack_70 = dStack_d0;
  local_58 = local_c8;
  dStack_50 = dStack_c0;
  local_48 = local_c8;
  local_40 = local_d8;
  dStack_38 = dStack_d0;
  for (; iVar13 != iVar9; iVar13 = iVar13 + 1) {
    dVar21 = (double)*c * dVar20;
    fVar1 = c[(int)uVar2];
    lVar18 = 0;
    dVar25 = dVar21;
    dVar26 = dVar21;
    for (lVar16 = 0; dVar27 = dVar25, dVar25 = dVar21, (int)uVar12 != (int)lVar16;
        lVar16 = lVar16 + 1) {
      dVar21 = dVar26 * local_78 + (double)c[lVar16] + dVar27 * local_d8 + dVar25 * local_c8;
      pfVar5[lVar16] = (float)dVar21;
      lVar18 = lVar18 + -4;
      dVar26 = dVar27;
    }
    dVar21 = (double)fVar1 * dVar22;
    dVar25 = dVar25 - dVar21;
    dVar27 = dVar27 - dVar21;
    dVar26 = dVar26 - dVar21;
    dVar21 = dVar21 * dVar22;
    TriggsM((double *)local_68,&local_128);
    dVar24 = (dVar21 + dVar25 * local_128 + dVar26 * dStack_118 + dVar27 * local_120) * dStack_80;
    lVar4 = (long)pfVar5 + (-4 - lVar18);
    pfVar5[lVar16 + -1] = (float)dVar24;
    c = (float *)((long)c - lVar18);
    dVar23 = (dVar21 + dVar25 * local_110 + dVar26 * local_100 + dVar27 * dStack_108) * local_88;
    dVar21 = (dStack_f8 * dVar25 + dVar21 + dStack_e8 * dVar26 + local_f0 * dVar27) * local_b8;
    for (iVar8 = w + -2; dVar25 = dVar23, -1 < iVar8; iVar8 = iVar8 + -1) {
      dVar21 = dVar24 * dStack_90 + (double)*(float *)(lVar4 + -4) * local_b8 +
               dVar25 * local_98 + local_78 * dVar21;
      *(float *)(lVar4 + -4) = (float)dVar21;
      lVar4 = lVar4 + -4;
      dVar23 = dVar24;
      dVar24 = dVar21;
      dVar21 = dVar25;
    }
    pfVar5 = (float *)(lVar4 + (long)w * 4);
  }
  lVar17 = (long)w << 3;
  lVar16 = g_malloc(lVar17);
  lVar18 = g_malloc(lVar17);
  lVar4 = g_malloc(lVar17);
  lVar6 = g_malloc(lVar17);
  lVar17 = g_malloc(lVar17);
  dVar25 = dStack_38;
  dVar21 = local_40;
  dVar20 = local_48;
  for (lVar10 = 0; uVar12 * 4 - lVar10 != 0; lVar10 = lVar10 + 4) {
    dVar26 = (double)*(float *)((long)b + lVar10) * (1.0 / local_a8);
    *(double *)(lVar4 + lVar10 * 2) = dVar26;
    *(double *)(lVar6 + lVar10 * 2) = dVar26;
    *(double *)(lVar17 + lVar10 * 2) = dVar26;
  }
  iVar13 = h + -2;
  pfVar5 = (float *)((long)b + lVar10 + (long)(iVar13 * w) * 4);
  for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    fVar1 = *pfVar5;
    pfVar5 = pfVar5 + 1;
    *(double *)(lVar16 + uVar11 * 8) = (double)fVar1 * dVar22;
  }
  pfVar5 = pfVar5 + -(long)(h * w);
  lVar10 = lVar4;
  lVar14 = lVar18;
  lVar15 = lVar17;
  lVar19 = lVar6;
  for (iVar8 = 0; lVar7 = lVar10, iVar8 != iVar9; iVar8 = iVar8 + 1) {
    for (lVar10 = 0; uVar12 * 4 - lVar10 != 0; lVar10 = lVar10 + 4) {
      dVar22 = *(double *)(lVar15 + lVar10 * 2) * dStack_d0 +
               *(double *)(lVar19 + lVar10 * 2) * local_d8 +
               *(double *)(lVar7 + lVar10 * 2) * local_c8 +
               (double)*(float *)((long)pfVar5 + lVar10);
      *(float *)((long)b + lVar10) = (float)dVar22;
      *(double *)(lVar14 + lVar10 * 2) = dVar22;
    }
    b = (float *)((long)b + lVar10);
    pfVar5 = (float *)((long)pfVar5 + lVar10);
    lVar10 = lVar14;
    lVar14 = lVar15;
    lVar15 = lVar19;
    lVar19 = lVar7;
  }
  TriggsM((double *)local_68,&local_128);
  for (uVar3 = uVar2; lVar10 = lVar16, -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar12 = (ulong)uVar3;
    dVar22 = *(double *)(lVar16 + uVar12 * 8);
    dVar26 = dVar22 * (1.0 / (1.0 - (dVar25 + dVar20 + dVar21)));
    dVar27 = *(double *)(lVar7 + uVar12 * 8) - dVar22;
    dVar23 = *(double *)(lVar19 + uVar12 * 8) - dVar22;
    dVar22 = *(double *)(lVar15 + uVar12 * 8) - dVar22;
    dVar24 = (dStack_118 * dVar22 + local_128 * dVar27 + dVar26 + local_120 * dVar23) * local_b8;
    b[-1] = (float)dVar24;
    b = b + -1;
    *(double *)(lVar7 + uVar12 * 8) = dVar24;
    *(double *)(lVar19 + uVar12 * 8) =
         (local_100 * dVar22 + dStack_108 * dVar23 + local_110 * dVar27 + dVar26) * local_b8;
    *(double *)(lVar15 + uVar12 * 8) =
         (dStack_e8 * dVar22 + dVar27 * dStack_f8 + dVar26 + local_f0 * dVar23) * local_b8;
  }
  for (; lVar14 = lVar7, lVar7 = lVar10, uVar3 = uVar2, -1 < iVar13; iVar13 = iVar13 + -1) {
    for (; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      uVar12 = (ulong)uVar3;
      dVar22 = *(double *)(lVar15 + uVar12 * 8) * dVar25 + *(double *)(lVar14 + uVar12 * 8) * dVar20
               + *(double *)(lVar19 + uVar12 * 8) * dVar21 + local_b8 * (double)b[-1];
      b[-1] = (float)dVar22;
      b = b + -1;
      *(double *)(lVar7 + uVar12 * 8) = dVar22;
    }
    lVar10 = lVar15;
    lVar15 = lVar19;
    lVar19 = lVar14;
  }
  g_free(lVar18);
  g_free(lVar4);
  g_free(lVar6);
  g_free(lVar17);
  g_free(lVar16);
  return;
}

Assistant:

void swap_gauss(SRCTYPE *c, DSTTYPE *b, int w, int h, double s) {
    double filter[7];

    /* calculate filter coefficients of x-direction */
    YvVfilterCoef(s, filter);
    /* filter in the x-direction */
    xline(c, b, w, h, filter);
    /* calculate filter coefficients in tanp-direction */
    /* YvVfilterCoef(s, filter); */
    yline(b, b, w, h, filter);
}